

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
 anon_unknown.dwarf_5733c63::InferXOnlyPubkey
           (XOnlyPubKey *xkey,ParseScriptContext ctx,SigningProvider *provider)

{
  _Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  _Var1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  pointer __p;
  undefined8 *puVar6;
  undefined8 *puVar7;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  CPubKey pubkey;
  __uniq_ptr_impl<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
  local_a8;
  KeyOriginInfo local_a0;
  CPubKey local_79;
  _Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false> local_38;
  
  local_38._M_head_impl = *(PubkeyProvider **)(in_FS_OFFSET + 0x28);
  XOnlyPubKey::GetEvenCorrespondingCPubKey
            (&local_79,(XOnlyPubKey *)CONCAT44(in_register_00000034,ctx));
  puVar6 = (undefined8 *)operator_new(0x50);
  *(undefined4 *)(puVar6 + 1) = 0;
  *puVar6 = &PTR__PubkeyProvider_013bdd58;
  memcpy((void *)((long)puVar6 + 0xc),&local_79,0x41);
  *(undefined1 *)((long)puVar6 + 0x4d) = 1;
  local_a0.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar5 = SigningProvider::GetKeyOriginByXOnly
                    (provider,(XOnlyPubKey *)CONCAT44(in_register_00000034,ctx),&local_a0);
  if (bVar5) {
    puVar7 = (undefined8 *)operator_new(0x40);
    puVar4 = local_a0.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    puVar3 = local_a0.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar2 = local_a0.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_a0.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a0.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined4 *)(puVar7 + 1) = 0;
    *puVar7 = &PTR__OriginPubkeyProvider_013bde78;
    *(uchar (*) [4])(puVar7 + 2) = local_a0.fingerprint;
    puVar7[3] = puVar2;
    puVar7[4] = puVar3;
    puVar7[5] = puVar4;
    puVar7[6] = puVar6;
    *(undefined1 *)(puVar7 + 7) = 0;
    local_a8._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::OriginPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
    .super__Head_base<0UL,_(anonymous_namespace)::OriginPubkeyProvider_*,_false>._M_head_impl =
         (tuple<(anonymous_namespace)::OriginPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
          )(_Tuple_impl<0UL,_(anonymous_namespace)::OriginPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
            )0x0;
    *(undefined8 **)(xkey->m_keydata).super_base_blob<256U>.m_data._M_elems = puVar7;
    std::
    unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                   *)&local_a8);
  }
  else {
    *(undefined8 **)(xkey->m_keydata).super_base_blob<256U>.m_data._M_elems = puVar6;
  }
  if (local_a0.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.path.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.path.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  _Var1.super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl =
       ((_Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
         *)(in_FS_OFFSET + 0x28))->
       super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>;
  if (_Var1.super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl ==
      (_Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>)local_38._M_head_impl) {
    return (__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
            )(tuple<(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
              )_Var1.super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>.
               _M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<PubkeyProvider> InferXOnlyPubkey(const XOnlyPubKey& xkey, ParseScriptContext ctx, const SigningProvider& provider)
{
    CPubKey pubkey{xkey.GetEvenCorrespondingCPubKey()};
    std::unique_ptr<PubkeyProvider> key_provider = std::make_unique<ConstPubkeyProvider>(0, pubkey, true);
    KeyOriginInfo info;
    if (provider.GetKeyOriginByXOnly(xkey, info)) {
        return std::make_unique<OriginPubkeyProvider>(0, std::move(info), std::move(key_provider), /*apostrophe=*/false);
    }
    return key_provider;
}